

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::post_nogood
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  pointer pHVar1;
  Proof *this_00;
  bool bVar2;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  HomomorphismSearcher *this_01;
  HomomorphismAssignmentInformation *a;
  pointer __args;
  Nogood<gss::innards::HomomorphismAssignment> nogood;
  HomomorphismModel *local_58;
  HomomorphismParams *pHStack_50;
  undefined8 local_48;
  
  this_01 = (HomomorphismSearcher *)&stack0xffffffffffffffa8;
  bVar2 = might_have_watches(this->params);
  if (bVar2) {
    local_48 = (void *)0x0;
    local_58 = (HomomorphismModel *)0x0;
    pHStack_50 = (HomomorphismParams *)0x0;
    pHVar1 = (assignments->values).
             super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (assignments->values).
                  super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pHVar1; __args = __args + 1)
    {
      if (__args->is_decision == true) {
        std::
        vector<gss::innards::HomomorphismAssignment,std::allocator<gss::innards::HomomorphismAssignment>>
        ::emplace_back<gss::innards::HomomorphismAssignment_const&>
                  ((vector<gss::innards::HomomorphismAssignment,std::allocator<gss::innards::HomomorphismAssignment>>
                    *)&stack0xffffffffffffffa8,&__args->assignment);
      }
    }
    Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>::
    post_nogood(&this->watches,
                (Nogood<gss::innards::HomomorphismAssignment> *)&stack0xffffffffffffffa8);
    this_00 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 != (Proof *)0x0) {
      assignments_as_proof_decisions
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &stack0xffffffffffffffc0,this_01,assignments);
      Proof::post_restart_nogood
                (this_00,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &stack0xffffffffffffffc0);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &stack0xffffffffffffffc0);
    }
    std::
    _Vector_base<gss::innards::HomomorphismAssignment,_std::allocator<gss::innards::HomomorphismAssignment>_>
    ::~_Vector_base((_Vector_base<gss::innards::HomomorphismAssignment,_std::allocator<gss::innards::HomomorphismAssignment>_>
                     *)&stack0xffffffffffffffa8);
  }
  return;
}

Assistant:

auto HomomorphismSearcher::post_nogood(const HomomorphismAssignments & assignments) -> void
{
    if (! might_have_watches(params))
        return;

    Nogood<HomomorphismAssignment> nogood;

    for (auto & a : assignments.values)
        if (a.is_decision)
            nogood.literals.emplace_back(a.assignment);

    watches.post_nogood(move(nogood));

    if (proof)
        proof->post_restart_nogood(assignments_as_proof_decisions(assignments));
}